

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_fwrite(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  ListStorage<MiniScript::TACLine> *pLVar2;
  long *plVar3;
  undefined4 *puVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  size_t sVar7;
  char *__ptr;
  Value fileWrapper;
  String data;
  Value self;
  Value local_b0;
  Value local_a0;
  ValueType local_90;
  undefined2 local_8f;
  anon_union_8_3_2f476f46_for_data local_88;
  _func_int **local_80;
  anon_union_8_3_2f476f46_for_data local_78;
  long *local_70;
  anon_union_8_3_2f476f46_for_data local_68;
  Value local_60;
  long *local_50;
  anon_union_8_3_2f476f46_for_data local_48;
  undefined1 local_40 [32];
  
  local_68.tempNum._0_1_ = '\0';
  plVar3 = (long *)operator_new(0x30);
  plVar3[1] = 1;
  *plVar3 = (long)&PTR__StringStorage_001bf0d8;
  plVar3[3] = 5;
  plVar3[4] = -1;
  puVar4 = (undefined4 *)operator_new__(5);
  plVar3[2] = (long)puVar4;
  *(undefined1 *)(puVar4 + 1) = 0;
  *puVar4 = 0x666c6573;
  local_70 = plVar3;
  MiniScript::Context::GetVar
            ((Context *)local_40,(String *)partialResult.rs,(LocalOnlyMode)&local_70);
  if ((local_70 != (long *)0x0) && (local_68.tempNum._0_1_ == '\0')) {
    plVar3 = local_70 + 1;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (**(code **)(*local_70 + 8))();
    }
    local_70 = (long *)0x0;
  }
  local_78.tempNum._0_1_ = '\0';
  pp_Var5 = (_func_int **)operator_new(0x30);
  pp_Var5[1] = (_func_int *)0x1;
  *pp_Var5 = (_func_int *)&PTR__StringStorage_001bf0d8;
  pp_Var5[3] = (_func_int *)0x5;
  pp_Var5[4] = (_func_int *)0xffffffffffffffff;
  p_Var6 = (_func_int *)operator_new__(5);
  pp_Var5[2] = p_Var6;
  p_Var6[4] = (code)0x0;
  *(undefined4 *)p_Var6 = 0x61746164;
  local_80 = pp_Var5;
  MiniScript::Context::GetVar
            ((Context *)&local_b0,(String *)partialResult.rs,(LocalOnlyMode)&local_80);
  MiniScript::Value::ToString((Value *)&local_50,(Machine *)&local_b0);
  if ((Temp < local_b0.type) && (local_b0.data.ref != (RefCountedStorage *)0x0)) {
    plVar3 = &(local_b0.data.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(local_b0.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_b0.data.number = 0.0;
  }
  if ((local_80 != (_func_int **)0x0) && (local_78.tempNum._0_1_ == '\0')) {
    pp_Var5 = local_80 + 1;
    *pp_Var5 = *pp_Var5 + -1;
    if (*pp_Var5 == (_func_int *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    local_80 = (_func_int **)0x0;
  }
  local_90 = _handle.type;
  local_8f._0_1_ = _handle.noInvoke;
  local_8f._1_1_ = _handle.localOnly;
  local_88 = _handle.data;
  if (_handle.data.ref != (RefCountedStorage *)0x0 && Temp < _handle.type) {
    (_handle.data.ref)->refCount = (_handle.data.ref)->refCount + 1;
  }
  MiniScript::Value::Lookup(&local_b0,(Value *)local_40);
  if ((Temp < local_90) && (local_88.ref != (RefCountedStorage *)0x0)) {
    plVar3 = &(local_88.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(local_88.ref)->_vptr_RefCountedStorage[1])();
    }
    local_88.number = 0.0;
  }
  if (local_b0.type == Handle) {
    if ((FILE *)local_b0.data.ref[1]._vptr_RefCountedStorage == (FILE *)0x0) {
      local_a0.type = MiniScript::Value::zero;
      local_a0.noInvoke = DAT_001c12e1;
      local_a0.localOnly = DAT_001c12e2;
      local_a0.data.ref = DAT_001c12e8;
      if (DAT_001c12e8 != (RefCountedStorage *)0x0 && Temp < MiniScript::Value::zero) {
        DAT_001c12e8->refCount = DAT_001c12e8->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_a0);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_a0.type) && (local_a0.data.ref != (RefCountedStorage *)0x0)) {
        plVar3 = &(local_a0.data.ref)->refCount;
        *plVar3 = *plVar3 + -1;
        if (*plVar3 == 0) {
          (*(local_a0.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_a0.data.number = 0.0;
      }
    }
    else {
      if (local_50 == (long *)0x0) {
        __ptr = "";
        sVar7 = 0;
      }
      else {
        __ptr = (char *)local_50[2];
        sVar7 = local_50[3] - 1;
      }
      sVar7 = fwrite(__ptr,1,sVar7,(FILE *)local_b0.data.ref[1]._vptr_RefCountedStorage);
      local_60.data.number = (double)(int)sVar7;
      local_60.type = Number;
      local_60.noInvoke = false;
      local_60.localOnly = Off;
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 &local_60);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((2 < local_60.type) && ((Context *)local_60.data.ref != (Context *)0x0)) {
        pbVar1 = (bool *)&(local_60.data.ref)->refCount;
        *(long *)pbVar1 = *(long *)pbVar1 + -1;
        if (*(long *)pbVar1 == 0) {
          (*(code *)(((List<MiniScript::TACLine> *)&(local_60.data.ref)->_vptr_RefCountedStorage)->
                     ls->super_RefCountedStorage).refCount)();
        }
        local_60.data.number = 0.0;
      }
    }
  }
  else {
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    pLVar2 = MiniScript::IntrinsicResult::Null;
    (context->code).ls = MiniScript::IntrinsicResult::Null;
    if (pLVar2 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar3 = &(pLVar2->super_RefCountedStorage).refCount;
      *plVar3 = *plVar3 + 1;
    }
  }
  if ((Temp < local_b0.type) && (local_b0.data.ref != (RefCountedStorage *)0x0)) {
    plVar3 = &(local_b0.data.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(local_b0.data.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if ((local_50 != (long *)0x0) && (local_48.tempNum._0_1_ == '\0')) {
    plVar3 = local_50 + 1;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (**(code **)(*local_50 + 8))();
    }
  }
  if ((Temp < local_40[0]) &&
     ((IntrinsicResultStorage *)local_40._8_8_ != (IntrinsicResultStorage *)0x0)) {
    plVar3 = (long *)(local_40._8_8_ + 8);
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*((RefCountedStorage *)local_40._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_fwrite(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	String data = context->GetVar("data").ToString();

	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult(Value::zero);

	size_t written = fwrite(data.c_str(), 1, data.sizeB(), handle);
	return IntrinsicResult((int)written);
}